

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

void Gia_ManDupCleanDfs_rec(Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj_local;
  
  if (pObj->Value != 0xffffffff) {
    pObj->Value = 0xffffffff;
    iVar1 = Gia_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                      ,0xfdb,"void Gia_ManDupCleanDfs_rec(Gia_Obj_t *)");
      }
      pGVar2 = Gia_ObjFanin0(pObj);
      Gia_ManDupCleanDfs_rec(pGVar2);
      pGVar2 = Gia_ObjFanin1(pObj);
      Gia_ManDupCleanDfs_rec(pGVar2);
    }
  }
  return;
}

Assistant:

void Gia_ManDupCleanDfs_rec( Gia_Obj_t * pObj )
{
    if ( !~pObj->Value )
        return;
    pObj->Value = ~0;
    if ( Gia_ObjIsCi(pObj) )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManDupCleanDfs_rec( Gia_ObjFanin0(pObj) );
    Gia_ManDupCleanDfs_rec( Gia_ObjFanin1(pObj) );
}